

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::SurfaceInteraction::Le(SurfaceInteraction *this,Vector3f *w,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  Point3fi *pPVar4;
  Point3fi *pPVar5;
  DiffuseAreaLight *this_00;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  SampledSpectrum SVar8;
  Tuple3<pbrt::Point3,_float> local_10;
  
  uVar2 = (this->areaLight).
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          .bits;
  this_00 = (DiffuseAreaLight *)(uVar2 & 0xffffffffffff);
  if (this_00 == (DiffuseAreaLight *)0x0) {
    SVar8.values.values = (array<float,_4>)(ZEXT816(0) << 0x40);
  }
  else {
    pPVar4 = &(this->super_Interaction).pi;
    pPVar5 = &(this->super_Interaction).pi;
    auVar6._0_4_ = (pPVar4->super_Point3<pbrt::Interval<float>_>).
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
    auVar6._4_4_ = (pPVar4->super_Point3<pbrt::Interval<float>_>).
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    auVar6._8_4_ = (pPVar5->super_Point3<pbrt::Interval<float>_>).
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    auVar6._12_4_ =
         (pPVar5->super_Point3<pbrt::Interval<float>_>).
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    uVar1 = *(undefined8 *)
             &(this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)(this->super_Interaction).pi.
                                                super_Point3<pbrt::Interval<float>_>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
                                                .high),0x10);
    auVar7._0_4_ = (float)uVar1 + auVar6._0_4_;
    auVar7._4_4_ = (float)((ulong)uVar1 >> 0x20) + auVar6._4_4_;
    auVar7._8_4_ = auVar6._8_4_ + 0.0;
    auVar7._12_4_ = auVar6._12_4_ + 0.0;
    auVar3._8_4_ = 0x3f000000;
    auVar3._0_8_ = 0x3f0000003f000000;
    auVar3._12_4_ = 0x3f000000;
    auVar6 = vmulps_avx512vl(auVar7,auVar3);
    local_10.z = ((this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
                 (this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
    local_10._0_8_ = vmovlps_avx(auVar6);
    if ((this_00->super_LightBase).type != Area) {
      LogFatal<char_const(&)[26]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.h"
                 ,0x34f,"Check failed: %s",(char (*) [26])"Type() == LightType::Area");
    }
    SVar8.values.values = (array<float,_4>)ZEXT816(0);
    if ((short)(uVar2 >> 0x30) == 6) {
      SVar8 = DiffuseAreaLight::L(this_00,(Point3f *)&local_10,&(this->super_Interaction).n,
                                  &(this->super_Interaction).uv,w,lambda);
    }
  }
  return (array<float,_4>)(array<float,_4>)SVar8;
}

Assistant:

SampledSpectrum SurfaceInteraction::Le(const Vector3f &w,
                                       const SampledWavelengths &lambda) const {
    return areaLight ? areaLight.L(p(), n, uv, w, lambda) : SampledSpectrum(0.f);
}